

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void SubtractionHelper<char,unsigned_long_long,10>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (char *lhs,unsigned_long_long *rhs,char *result)

{
  byte t;
  uint32_t uVar1;
  ulong uVar2;
  
  t = *lhs;
  uVar2 = *rhs;
  if ((char)t < '\0') {
    uVar1 = AbsValueHelper<char,_0>::Abs(t);
    if (uVar2 <= 0x80 - (ulong)uVar1) {
      t = *lhs;
      uVar2 = *rhs;
      goto LAB_00109e86;
    }
  }
  else if (uVar2 <= ((ulong)t | 0x80)) {
LAB_00109e86:
    *result = t - (char)uVar2;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is any signed int, rhs unsigned int64
        // check against available range

        // We need the absolute value of std::numeric_limits<T>::min()
        // This will give it to us without extraneous compiler warnings
        SAFEINT_CONSTEXPR11 std::uint64_t AbsMinIntT = (std::uint64_t)std::numeric_limits<T>::max() + 1;

        if( lhs < 0 )
        {
            if( rhs <= AbsMinIntT - AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( lhs ) )
            {
                result = (T)( lhs - rhs );
                return;
            }
        }
        else
        {
            if( rhs <= AbsMinIntT + (std::uint64_t)lhs )
            {
                result = (T)( lhs - rhs );
                return;
            }
        }

        E::SafeIntOnOverflow();
    }